

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

void __thiscall PointerType::PointerType(PointerType *this,Type *type)

{
  string *psVar1;
  TypeKind TVar2;
  string sStack_48;
  
  (this->super_Type).kind = TK_PointerType;
  (this->super_Type).isConst = false;
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__PointerType_001988f8;
  (this->sizes)._M_dataplus._M_p = (pointer)&(this->sizes).field_2;
  (this->sizes)._M_string_length = 0;
  (this->sizes).field_2._M_local_buf[0] = '\0';
  (this->structName)._M_dataplus._M_p = (pointer)&(this->structName).field_2;
  (this->structName)._M_string_length = 0;
  (this->structName).field_2._M_local_buf[0] = '\0';
  this->levels = 1;
  this->isArrayPointer = false;
  this->isStructPointer = false;
  if (type != (Type *)0x0) {
    psVar1 = &this->structName;
    TVar2 = type->kind;
    if (TVar2 == TK_PointerType) {
      this->isArrayPointer = type[1].isConst;
      this->isStructPointer = *(bool *)&type[4]._vptr_Type;
      std::__cxx11::string::_M_assign((string *)psVar1);
      this->levels = type[1].kind + TK_StructType;
      std::__cxx11::string::_M_assign((string *)&this->sizes);
      TVar2 = type->kind;
    }
    if (TVar2 == TK_ArrayType) {
      this->isArrayPointer = true;
      ArrayType::sizeToString_abi_cxx11_(&sStack_48,(ArrayType *)type);
      std::__cxx11::string::operator=((string *)&this->sizes,(string *)&sStack_48);
      std::__cxx11::string::~string((string *)&sStack_48);
      this->isStructPointer = type[1].isConst;
      std::__cxx11::string::_M_assign((string *)psVar1);
      TVar2 = type->kind;
    }
    if (TVar2 == TK_StructType) {
      this->isStructPointer = true;
      std::__cxx11::string::_M_assign((string *)psVar1);
    }
  }
  this->type = type;
  return;
}

Assistant:

PointerType::PointerType(Type* type): Type(TK_PointerType) {
    levels = 1;
    isArrayPointer = false;
    isStructPointer = false;

    if (auto PT = llvm::dyn_cast_or_null<PointerType>(type)) {
        isArrayPointer = PT->isArrayPointer;
        isStructPointer = PT->isStructPointer;
        structName = PT->structName;
        levels = PT->levels + 1;
        sizes = PT->sizes;
    }

    if (auto AT = llvm::dyn_cast_or_null<ArrayType>(type)) {
        isArrayPointer = true;
        sizes = AT->sizeToString();

        isStructPointer = AT->isStructArray;
        structName = AT->structName;
    }

    if (auto ST = llvm::dyn_cast_or_null<StructType>(type)) {
        isStructPointer = true;
        structName = ST->name;
    }

    this->type = type;
}